

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta,double obj_amp)

{
  undefined1 auVar1 [16];
  int k;
  double *pdVar2;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bound_factor *pbVar3;
  bool bVar4;
  int selected;
  undefined8 extraout_RAX;
  _Head_base<0UL,_int_*,_false> _Var5;
  long lVar6;
  rc_data *prVar7;
  rc_data *__first;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  rc_size local_90;
  undefined1 local_88 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_78;
  bit_array *local_70;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_68;
  undefined8 local_60;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (first._M_current == last._M_current) {
    uVar8._0_4_ = 0;
    uVar8._4_4_ = 0;
  }
  else {
    local_58._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )((long)this + 0x10);
    uVar8._0_4_ = 0;
    uVar8._4_4_ = 0;
    local_78._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)(tuple<int_*,_std::default_delete<int[]>_>)this;
    local_70 = x;
    local_68._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )last._M_current;
    local_50 = kappa;
    local_48 = delta;
    local_40 = theta;
    local_38 = obj_amp;
    do {
      k = *first._M_current;
      if (*(int *)((long)this + 0x88) <= k) {
        push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_88,
                 (int)local_58._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                      _M_head_impl);
      if (local_88._8_8_ != local_88._0_8_) {
        pdVar2 = (((unique_ptr<double[],_std::default_delete<double[]>_> *)((long)this + 0x50))->
                 _M_t).super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        _Var5._M_head_impl = (int *)local_88._8_8_;
        do {
          pdVar2[*_Var5._M_head_impl] = local_40 * pdVar2[*_Var5._M_head_impl];
          _Var5._M_head_impl = _Var5._M_head_impl + 8;
        } while (_Var5._M_head_impl != (int *)local_88._0_8_);
      }
      local_90 = solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                 ::compute_reduced_costs<baryonyx::bit_array>
                           ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                             *)this,(row_iterator)local_88._8_8_,(row_iterator)local_88._0_8_,x);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_38;
      if (((ulong)local_90 & 0xffffffff) != 0) {
        prVar7 = (((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                    *)((long)this + 0x68))->_M_t).
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                 ._M_head_impl;
        pdVar2 = ((*(cost_type **)((long)this + 0x80))->linear_elements)._M_t.
                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        lVar6 = 0;
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = pdVar2[((row_iterator)
                                (local_88._8_8_ + (long)*(int *)((long)&prVar7->id + lVar6) * 8))->
                                column];
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)((long)&prVar7->value + lVar6);
          auVar1 = vfmadd213sd_fma(auVar9,auVar10,auVar1);
          *(long *)((long)&prVar7->value + lVar6) = auVar1._0_8_;
          lVar6 = lVar6 + 0x10;
        } while (((ulong)local_90 & 0xffffffff) << 4 != lVar6);
      }
      if (1 < local_90.r_size) {
        lVar6 = (long)local_90.r_size;
        __g = *(random_engine **)((long)this + 8);
        __first = (((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                     *)((long)this + 0x68))->_M_t).
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                  ._M_head_impl;
        local_60 = uVar8;
        std::
        __introsort_loop<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar6,(int)LZCOUNT(lVar6) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar6);
        prVar7 = __first + 1;
        lVar6 = lVar6 * 0x10 + -0x10;
        do {
          if ((__first->value != prVar7->value) || (NAN(__first->value) || NAN(prVar7->value))) {
            std::
            shuffle<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar7,__g);
            __first = prVar7;
          }
          prVar7 = prVar7 + 1;
          lVar6 = lVar6 + -0x10;
        } while (lVar6 != 0);
        std::
        shuffle<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,prVar7,__g);
        last._M_current =
             (int *)local_68._M_t.
                    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                    _M_head_impl;
        x = local_70;
        this = (solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>
                *)local_78._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
        uVar8 = local_60;
      }
      pbVar3 = (((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                  *)((long)this + 0x70))->_M_t).
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_false>
               ._M_head_impl;
      selected = solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                 ::select_variables((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                                     *)this,&local_90,pbVar3[k].min,pbVar3[k].max);
      bVar4 = affect<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                        ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                          *)this,x,(row_value *)local_88._8_8_,k,selected,local_90.r_size,local_50,
                         local_48);
      uVar8._0_1_ = (byte)uVar8 | bVar4;
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)uVar8 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }